

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O3

RegEx * YAML::Exp::AnchorEnd(void)

{
  int iVar1;
  RegEx *ex2;
  string local_50;
  RegEx local_30;
  
  if (AnchorEnd()::e == '\0') {
    iVar1 = __cxa_guard_acquire(&AnchorEnd()::e);
    if (iVar1 != 0) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"?:,]}%@`","");
      RegEx::RegEx(&local_30,&local_50,REGEX_OR);
      ex2 = BlankOrBreak();
      operator|(&AnchorEnd::e,&local_30,ex2);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_30.m_params);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      __cxa_atexit(RegEx::~RegEx,&AnchorEnd::e,&__dso_handle);
      __cxa_guard_release(&AnchorEnd()::e);
    }
  }
  return &AnchorEnd::e;
}

Assistant:

inline const RegEx& AnchorEnd() {
  static const RegEx e = RegEx("?:,]}%@`", REGEX_OR) | BlankOrBreak();
  return e;
}